

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

size_t __thiscall
llama_context::state_seq_load_file
          (llama_context *this,llama_seq_id seq_id,char *filepath,llama_token *tokens_out,
          size_t n_token_capacity,size_t *n_token_count_out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  ulong uVar8;
  llama_file file;
  llama_io_read_file io;
  
  llama_file::llama_file(&file,filepath,"rb");
  uVar1 = llama_file::read_u32(&file);
  uVar2 = llama_file::read_u32(&file);
  if (uVar2 == 2 && uVar1 == 0x67677371) {
    uVar1 = llama_file::read_u32(&file);
    uVar8 = (ulong)uVar1;
    if (n_token_capacity < uVar8) {
      sVar3 = 0;
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: token count in sequence state file exceeded capacity! %u > %zu\n",
                         "state_seq_load_file",(ulong)uVar1,n_token_capacity);
    }
    else {
      llama_file::read_raw(&file,tokens_out,uVar8 * 4);
      *n_token_count_out = uVar8;
      sVar3 = llama_file::size(&file);
      sVar4 = llama_file::tell(&file);
      io.super_llama_io_read_i._vptr_llama_io_read_i =
           (_func_int **)&PTR__llama_io_read_file_002cd590;
      io.size_read = 0;
      io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      io.temp_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      io.file = &file;
      sVar5 = state_seq_read_data(this,&io.super_llama_io_read_i,seq_id);
      if (sVar5 == 0) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to restore sequence state\n",
                           "state_seq_load_file");
      }
      else {
        if (sVar3 - sVar4 < sVar5) {
          pcVar6 = "nread <= state_size";
          uVar7 = 0x7c9;
LAB_001d57b5:
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                     ,uVar7,"GGML_ASSERT(%s) failed",pcVar6);
        }
        sVar3 = *n_token_count_out;
        sVar4 = llama_file::tell(&file);
        if (sVar5 + sVar3 * 4 + 0xc != sVar4) {
          pcVar6 = 
          "nread + sizeof(uint32_t) * 3 + sizeof(llama_token) * *n_token_count_out == file.tell()";
          uVar7 = 0x7ca;
          goto LAB_001d57b5;
        }
      }
      llama_io_read_file::~llama_io_read_file(&io);
      if (sVar5 == 0) {
        sVar3 = 0;
      }
      else {
        sVar3 = llama_file::tell(&file);
      }
    }
  }
  else {
    sVar3 = 0;
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: unknown (magic, version) for sequence state file: %08x, %08x\n",
                       "state_seq_load_file",(ulong)uVar1,(ulong)uVar2);
  }
  llama_file::~llama_file(&file);
  return sVar3;
}

Assistant:

size_t llama_context::state_seq_load_file(llama_seq_id seq_id, const char * filepath, llama_token * tokens_out, size_t n_token_capacity, size_t * n_token_count_out) {
    llama_file file(filepath, "rb");

    // version checks
    {
        const uint32_t magic   = file.read_u32();
        const uint32_t version = file.read_u32();

        if (magic != LLAMA_STATE_SEQ_MAGIC || version != LLAMA_STATE_SEQ_VERSION) {
            LLAMA_LOG_ERROR("%s: unknown (magic, version) for sequence state file: %08x, %08x\n", __func__, magic, version);
            return 0;
        }
    }

    // load the prompt
    {
        const uint32_t n_token_count = file.read_u32();

        if (n_token_count > n_token_capacity) {
            LLAMA_LOG_ERROR("%s: token count in sequence state file exceeded capacity! %u > %zu\n", __func__, n_token_count, n_token_capacity);
            return 0;
        }

        file.read_raw(tokens_out, sizeof(llama_token) * n_token_count);
        *n_token_count_out = n_token_count;
    }

    // restore the context state
    {
        const size_t state_size = file.size() - file.tell();
        llama_io_read_file io(&file);
        const size_t nread = state_seq_read_data(io, seq_id);
        if (!nread) {
            LLAMA_LOG_ERROR("%s: failed to restore sequence state\n", __func__);
            return 0;
        }
        GGML_ASSERT(nread <= state_size);
        GGML_ASSERT(nread + sizeof(uint32_t) * 3 + sizeof(llama_token) * *n_token_count_out == file.tell());
    }

    return file.tell();
}